

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kats_test.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_279e::read_hex(string *data)

{
  ulong uVar1;
  ulong uVar2;
  void *this;
  ulong in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  uint c;
  istringstream iss;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *res;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint local_1d4;
  string local_1d0 [8];
  size_type in_stack_fffffffffffffe38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe40;
  istringstream local_1b0 [384];
  ulong local_30;
  undefined1 local_11;
  ulong local_10;
  
  local_11 = 0;
  this_00 = in_RDI;
  local_10 = in_RSI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x103c71);
  std::__cxx11::string::size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  for (local_30 = 0; uVar1 = local_30, uVar2 = std::__cxx11::string::size(), uVar1 < uVar2;
      local_30 = local_30 + 2) {
    std::__cxx11::string::substr((ulong)local_1d0,local_10);
    std::__cxx11::istringstream::istringstream(local_1b0,local_1d0,8);
    std::__cxx11::string::~string(local_1d0);
    this = (void *)std::istream::operator>>(local_1b0,std::hex);
    std::istream::operator>>(this,&local_1d4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_int>
              (this_00,(uint *)in_RDI);
    std::__cxx11::istringstream::~istringstream(local_1b0);
  }
  return in_RDI;
}

Assistant:

std::vector<uint8_t> read_hex(const std::string& data) {
    std::vector<uint8_t> res;
    res.reserve(data.size() / 2);

    for (std::size_t i = 0; i < data.size(); i += 2) {
      std::istringstream iss{data.substr(i, 2)};
      unsigned int c;
      iss >> std::hex >> c;
      res.emplace_back(c & 0xff);
    }
    return res;
  }